

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall
helics::apps::Connector::addConnection
          (Connector *this,string_view interface1,string_view interface2,
          InterfaceDirection direction,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *connectionTags)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view tagName;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view interfaceName;
  string_view interfaceName_00;
  bool bVar1;
  int iVar2;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
  this_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  size_t in_RDI;
  undefined8 in_R8;
  int in_R9D;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  Connection conn;
  string_view iview2;
  string_view iview1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> svtags;
  Connection *in_stack_fffffffffffffe08;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
  in_stack_fffffffffffffe10;
  Connection *in_stack_fffffffffffffe18;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
  in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  size_t in_stack_fffffffffffffe38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe40;
  Connector *in_stack_fffffffffffffe80;
  char *pcVar3;
  string_view local_128;
  string_view local_118;
  int local_108;
  undefined8 local_d8;
  undefined8 uStack_d0;
  string_view local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  string_view local_a0;
  __sv_type local_90;
  Connector *local_80;
  reference local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  char local_48 [28];
  int local_2c;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  undefined8 uStack_8;
  
  pcVar3 = local_48;
  local_2c = in_R9D;
  local_20 = in_RCX;
  uStack_18 = in_R8;
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2630c4);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(in_stack_00000008);
  CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38);
  local_60 = in_stack_00000008;
  local_68._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CLI::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe08);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CLI::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe08);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffe10._M_cur,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffe08), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_78 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_68);
    local_90 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffe10._M_cur);
    tagName._M_str = (char *)in_stack_fffffffffffffe40;
    tagName._M_len = in_stack_fffffffffffffe38;
    in_stack_fffffffffffffe80 =
         (Connector *)
         addTag((Connector *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),tagName);
    local_80 = in_stack_fffffffffffffe80;
    CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffe10._M_cur,(value_type_conflict4 *)in_stack_fffffffffffffe08);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_68);
  }
  local_b8 = local_10;
  uStack_b0 = uStack_8;
  interfaceName._M_str = pcVar3;
  interfaceName._M_len = in_RDI;
  local_a0 = addInterface(in_stack_fffffffffffffe80,interfaceName);
  local_d8 = local_20;
  uStack_d0 = uStack_18;
  interfaceName_00._M_str = pcVar3;
  interfaceName_00._M_len = in_RDI;
  local_118 = addInterface(in_stack_fffffffffffffe80,interfaceName_00);
  local_108 = local_2c;
  local_c8 = local_118;
  local_128 = local_a0;
  CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe10._M_cur,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe08);
  CLI::std::
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffe10._M_cur,in_stack_fffffffffffffe08);
  iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe28);
  if (iVar2 == 0) {
    if (local_2c == -1) {
      std::swap<std::basic_string_view<char,std::char_traits<char>>>(&local_128,&local_118);
      CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
      emplace_back<helics::apps::Connection>
                ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
                 in_stack_fffffffffffffe20._M_cur,in_stack_fffffffffffffe18);
    }
    else if (local_2c == 0) {
      std::vector<helics::apps::Connection,std::allocator<helics::apps::Connection>>::
      emplace_back<helics::apps::Connection&>
                ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
                 in_stack_fffffffffffffe20._M_cur,in_stack_fffffffffffffe18);
      std::swap<std::basic_string_view<char,std::char_traits<char>>>(&local_128,&local_118);
      CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
      emplace_back<helics::apps::Connection>
                ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
                 in_stack_fffffffffffffe20._M_cur,in_stack_fffffffffffffe18);
    }
    else if (local_2c == 1) {
      CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
      emplace_back<helics::apps::Connection>
                ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
                 in_stack_fffffffffffffe20._M_cur,in_stack_fffffffffffffe18);
    }
  }
  else if (local_2c == -1) {
    std::
    unordered_multimap<std::basic_string_view<char,std::char_traits<char>>,helics::apps::Connection,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>>>
    ::emplace<std::basic_string_view<char,std::char_traits<char>>&,helics::apps::Connection>
              ((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
                *)in_stack_fffffffffffffe18,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe10._M_cur,
               in_stack_fffffffffffffe08);
  }
  else if (local_2c == 0) {
    this_00._M_cur =
         (__node_type *)
         std::
         unordered_multimap<std::basic_string_view<char,std::char_traits<char>>,helics::apps::Connection,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>>>
         ::emplace<std::basic_string_view<char,std::char_traits<char>>&,helics::apps::Connection&>
                   ((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
                     *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10._M_cur,
                    in_stack_fffffffffffffe08);
    __x._M_str = (char *)in_stack_fffffffffffffe40;
    __x._M_len = in_stack_fffffffffffffe38;
    __y._M_str._0_4_ = in_stack_fffffffffffffe30;
    __y._M_len = (size_t)in_stack_fffffffffffffe28;
    __y._M_str._4_4_ = local_2c;
    bVar1 = std::operator==(__x,__y);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffe10._M_cur =
           (__node_type *)
           std::
           unordered_multimap<std::basic_string_view<char,std::char_traits<char>>,helics::apps::Connection,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>>>
           ::emplace<std::basic_string_view<char,std::char_traits<char>>&,helics::apps::Connection>
                     (this_00._M_cur,in_stack_fffffffffffffe10._M_cur,in_stack_fffffffffffffe08);
    }
  }
  else if (local_2c == 1) {
    in_stack_fffffffffffffe20._M_cur =
         (__node_type *)
         std::
         unordered_multimap<std::basic_string_view<char,std::char_traits<char>>,helics::apps::Connection,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>>>
         ::emplace<std::basic_string_view<char,std::char_traits<char>>&,helics::apps::Connection>
                   ((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
                     *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10._M_cur,
                    in_stack_fffffffffffffe08);
  }
  Connection::~Connection((Connection *)in_stack_fffffffffffffe10._M_cur);
  CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe20._M_cur);
  return;
}

Assistant:

void Connector::addConnection(std::string_view interface1,
                              std::string_view interface2,
                              InterfaceDirection direction,
                              const std::vector<std::string>& connectionTags)
{
    std::vector<std::size_t> svtags;
    svtags.reserve(connectionTags.size());
    for (const auto& tag : connectionTags) {
        svtags.push_back(addTag(tag));
    }
    auto iview1 = addInterface(interface1);
    auto iview2 = addInterface(interface2);
    Connection conn{iview1, iview2, direction, std::move(svtags), nullptr};
    if (iview1.compare(0, 6, "REGEX:") == 0) {
        switch (direction) {
            case InterfaceDirection::TO_FROM:
                std::swap(conn.interface1, conn.interface2);
                matchers.emplace_back(std::move(conn));
                break;
            case InterfaceDirection::FROM_TO:
                matchers.emplace_back(std::move(conn));
                break;
            case InterfaceDirection::BIDIRECTIONAL:
                matchers.emplace_back(conn);
                std::swap(conn.interface1, conn.interface2);
                matchers.emplace_back(std::move(conn));
                break;
        }
    } else {
        switch (direction) {
            case InterfaceDirection::TO_FROM:
                connections.emplace(iview2, std::move(conn));
                break;
            case InterfaceDirection::FROM_TO:
                connections.emplace(iview1, std::move(conn));
                break;
            case InterfaceDirection::BIDIRECTIONAL:
                connections.emplace(iview2, conn);
                if (iview1 != iview2) {
                    connections.emplace(iview1, std::move(conn));
                }
                break;
        }
    }
}